

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O0

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  IOStream *__p;
  pointer pIVar5;
  DeadlyImportError *pDVar6;
  aiAnimation *this_00;
  aiNodeAnim *paVar7;
  reference ppaVar8;
  size_type sVar9;
  aiNodeAnim **ppaVar10;
  ulong uVar11;
  aiVectorKey *paVar12;
  float *pfVar13;
  Logger *this_01;
  int *piVar14;
  pointer paVar15;
  aiNode *paVar16;
  aiNode **ppaVar17;
  aiAnimation **ppaVar18;
  double dVar19;
  aiVectorKey *local_3d0;
  aiVectorKey *local_388;
  undefined1 local_298 [8];
  SkeletonMeshBuilder maker;
  aiNode *nd;
  aiNodeAnim *na;
  int local_230;
  uint i_3;
  string local_228;
  uint local_208;
  undefined1 local_202;
  allocator local_201;
  uint i_2;
  undefined1 local_1da;
  allocator local_1d9;
  string local_1d8;
  double *local_1b8;
  aiVectorKey *sub;
  string local_1a8;
  aiVectorKey *local_188;
  aiVectorKey *old;
  aiNodeAnim *s;
  uint i_1;
  int frame;
  uint filled;
  uint i;
  uint alloc;
  undefined1 local_13a;
  allocator local_139;
  string local_138;
  char *local_118;
  char *ot;
  aiNodeAnim *nda;
  undefined1 local_100 [8];
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  int local_e0;
  float d;
  int last;
  int first;
  unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> anim;
  char *buffer;
  vector<char,_std::allocator<char>_> mBuffer2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  allocator local_51;
  string local_50;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> local_30;
  unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_> file;
  IOSystem *pIOHandler_local;
  aiScene *pScene_local;
  string *pFile_local;
  CSMImporter *this_local;
  
  file._M_t.super___uniq_ptr_impl<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>._M_t.
  super__Tuple_impl<0UL,_Assimp::IOStream_*,_std::default_delete<Assimp::IOStream>_>.
  super__Head_base<0UL,_Assimp::IOStream_*,_false>._M_head_impl =
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       (__uniq_ptr_data<Assimp::IOStream,_std::default_delete<Assimp::IOStream>,_true,_true>)
       pIOHandler;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"rb",&local_51);
  __p = IOSystem::Open(pIOHandler,pFile,&local_50);
  std::unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>>::
  unique_ptr<std::default_delete<Assimp::IOStream>,void>
            ((unique_ptr<Assimp::IOStream,std::default_delete<Assimp::IOStream>> *)&local_30,__p);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  if (pIVar5 == (pointer)0x0) {
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 1;
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_a8,"Failed to open CSM file ",pFile);
    std::operator+(&local_88,&local_a8,".");
    DeadlyImportError::DeadlyImportError(pDVar6,&local_88);
    mBuffer2.super__Vector_base<char,_std::allocator<char>_>._M_impl._23_1_ = 0;
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)&buffer);
  pIVar5 = std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::get(&local_30)
  ;
  BaseImporter::TextFileToBuffer(pIVar5,(vector<char,_std::allocator<char>_> *)&buffer,FORBID_EMPTY)
  ;
  anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
  super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
       std::vector<char,_std::allocator<char>_>::operator[]
                 ((vector<char,_std::allocator<char>_> *)&buffer,0);
  this_00 = (aiAnimation *)operator_new(0x448);
  aiAnimation::aiAnimation(this_00);
  std::unique_ptr<aiAnimation,std::default_delete<aiAnimation>>::
  unique_ptr<std::default_delete<aiAnimation>,void>
            ((unique_ptr<aiAnimation,std::default_delete<aiAnimation>> *)&last,this_00);
  d = 0.0;
  local_e0 = 0xffffff;
  do {
    do {
      while( true ) {
        while( true ) {
          while( true ) {
            while( true ) {
              while( true ) {
                SkipSpaces<char>((char **)&anim);
                iVar3 = local_e0;
                if (*(char *)anim._M_t.
                             super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                             .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl == '\0') {
                  local_230 = 0;
                  piVar14 = std::min<int>((int *)&d,&local_230);
                  iVar1 = *piVar14;
                  paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                            operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *
                                       )&last);
                  paVar15->mDuration = (double)(iVar3 - iVar1);
                  paVar16 = (aiNode *)operator_new(0x478);
                  aiNode::aiNode(paVar16);
                  pScene->mRootNode = paVar16;
                  aiString::Set(&pScene->mRootNode->mName,"$CSM_DummyRoot");
                  paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                            operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *
                                       )&last);
                  pScene->mRootNode->mNumChildren = paVar15->mNumChannels;
                  paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                            operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *
                                       )&last);
                  ppaVar17 = (aiNode **)operator_new__((ulong)paVar15->mNumChannels << 3);
                  pScene->mRootNode->mChildren = ppaVar17;
                  for (na._4_4_ = 0;
                      paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                                operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>
                                            *)&last), na._4_4_ < paVar15->mNumChannels;
                      na._4_4_ = na._4_4_ + 1) {
                    paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                              operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>
                                          *)&last);
                    paVar7 = paVar15->mChannels[na._4_4_];
                    paVar16 = (aiNode *)operator_new(0x478);
                    aiNode::aiNode(paVar16);
                    pScene->mRootNode->mChildren[na._4_4_] = paVar16;
                    maker._72_8_ = paVar16;
                    paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                              operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>
                                          *)&last);
                    aiString::operator=((aiString *)maker._72_8_,
                                        &paVar15->mChannels[na._4_4_]->mNodeName);
                    *(aiNode **)(maker._72_8_ + 0x448) = pScene->mRootNode;
                    aiMatrix4x4t<float>::Translation
                              (&paVar7->mPositionKeys->mValue,
                               (aiMatrix4x4t<float> *)(maker._72_8_ + 0x404));
                  }
                  pScene->mNumAnimations = 1;
                  ppaVar18 = (aiAnimation **)operator_new__(8);
                  pScene->mAnimations = ppaVar18;
                  paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::
                            operator->((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *
                                       )&last);
                  aiString::Set(&paVar15->mName,"$CSM_MasterAnim");
                  paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::release
                                      ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *
                                       )&last);
                  *pScene->mAnimations = paVar15;
                  pScene->mFlags = pScene->mFlags | 1;
                  if ((this->noSkeletonMesh & 1U) == 0) {
                    SkeletonMeshBuilder::SkeletonMeshBuilder
                              ((SkeletonMeshBuilder *)local_298,pScene,pScene->mRootNode,true);
                    SkeletonMeshBuilder::~SkeletonMeshBuilder((SkeletonMeshBuilder *)local_298);
                  }
                  std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::~unique_ptr
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
                  std::vector<char,_std::allocator<char>_>::~vector
                            ((vector<char,_std::allocator<char>_> *)&buffer);
                  std::unique_ptr<Assimp::IOStream,_std::default_delete<Assimp::IOStream>_>::
                  ~unique_ptr(&local_30);
                  return;
                }
                if (*(char *)anim._M_t.
                             super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                             _M_t.
                             super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                             .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl == '$')
                break;
                SkipLine<char>((char **)&anim);
              }
              anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
              super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
              super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
                   (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
                   ((long)anim._M_t.
                          super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t
                          .super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 1);
              bVar4 = TokenMatchI((char **)&anim,"firstframe",10);
              if (!bVar4) break;
              SkipSpaces<char>((char **)&anim);
              d = (float)strtol10((char *)anim._M_t.
                                          super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                          .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                                  (char **)&anim);
            }
            bVar4 = TokenMatchI((char **)&anim,"lastframe",9);
            if (!bVar4) break;
            SkipSpaces<char>((char **)&anim);
            local_e0 = strtol10((char *)anim._M_t.
                                        super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                        .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                                (char **)&anim);
          }
          bVar4 = TokenMatchI((char **)&anim,"rate",4);
          if (!bVar4) break;
          SkipSpaces<char>((char **)&anim);
          anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
          super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
               fast_atoreal_move<float>
                         ((char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                          (float *)((long)&anims_temp.
                                           super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                          true);
          dVar19 = (double)anims_temp.
                           super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_;
          paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                              ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
          paVar15->mTicksPerSecond = dVar19;
        }
        bVar4 = TokenMatchI((char **)&anim,"order",5);
        if (!bVar4) break;
        std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::vector
                  ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100);
        std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve
                  ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100,0x1e);
        while( true ) {
          SkipSpaces<char>((char **)&anim);
          bVar4 = IsLineEnd<char>(*(char *)anim._M_t.
                                           super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                           .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl
                                 );
          if (((bVar4) && (bVar4 = SkipSpacesAndLineEnd<char>((char **)&anim), bVar4)) &&
             (*(char *)anim._M_t.
                       super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                       super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                       super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl == '$')) break;
          paVar7 = (aiNodeAnim *)operator_new(0x438);
          aiNodeAnim::aiNodeAnim(paVar7);
          nda = paVar7;
          std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::push_back
                    ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100,&nda);
          ppaVar8 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::back
                              ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100);
          ot = (char *)*ppaVar8;
          local_118 = (((value_type)ot)->mNodeName).data;
          while (bVar4 = IsSpaceOrNewLine<char>
                                   (*(char *)anim._M_t.
                                             super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                             .super__Head_base<0UL,_aiAnimation_*,_false>.
                                             _M_head_impl), ((bVar4 ^ 0xffU) & 1) != 0) {
            *local_118 = *(char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl;
            local_118 = local_118 + 1;
            anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
            super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
            super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
                 (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
                 (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
                 ((long)anim._M_t.
                        super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
                        super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                        super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl + 1);
          }
          *local_118 = '\0';
          *(int *)ot = (int)local_118 - ((int)ot + 4);
        }
        sVar9 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::size
                          ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100);
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        paVar15->mNumChannels = (uint)sVar9;
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        if (paVar15->mNumChannels == 0) {
          local_13a = 1;
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_138,"CSM: Empty $order section",&local_139);
          DeadlyImportError::DeadlyImportError(pDVar6,&local_138);
          local_13a = 0;
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        ppaVar10 = (aiNodeAnim **)operator_new__((ulong)paVar15->mNumChannels << 3);
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        paVar15->mChannels = ppaVar10;
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        ppaVar10 = paVar15->mChannels;
        ppaVar8 = std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::operator[]
                            ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100,0);
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        memcpy(ppaVar10,ppaVar8,(ulong)paVar15->mNumChannels << 3);
        std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::~vector
                  ((vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> *)local_100);
      }
      bVar4 = TokenMatchI((char **)&anim,"points",6);
    } while (!bVar4);
    paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                        ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
    if (paVar15->mNumChannels == 0) {
      i._2_1_ = 1;
      pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&alloc,
                 "CSM: \'$order\' section is required to appear prior to \'$points\'",
                 (allocator *)((long)&i + 3));
      DeadlyImportError::DeadlyImportError(pDVar6,(string *)&alloc);
      i._2_1_ = 0;
      __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    filled = 100;
    if (local_e0 != 0xffffff) {
      filled = ((uint)(local_e0 - (int)d) >> 2) + (local_e0 - (int)d);
      for (frame = 0; iVar3 = frame,
          paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                              ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last),
          (uint)iVar3 < paVar15->mNumChannels; frame = frame + 1) {
        uVar11 = (ulong)filled;
        paVar12 = (aiVectorKey *)operator_new__(uVar11 * 0x18);
        if (uVar11 != 0) {
          local_388 = paVar12;
          do {
            aiVectorKey::aiVectorKey(local_388);
            local_388 = local_388 + 1;
          } while (local_388 != paVar12 + uVar11);
        }
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        paVar15->mChannels[(uint)frame]->mPositionKeys = paVar12;
      }
    }
    i_1 = 0;
    while( true ) {
      SkipSpaces<char>((char **)&anim);
      bVar4 = IsLineEnd<char>(*(char *)anim._M_t.
                                       super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                       .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl);
      if ((bVar4) &&
         ((bVar4 = SkipSpacesAndLineEnd<char>((char **)&anim), !bVar4 ||
          (*(char *)anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>.
                    _M_t.super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
                    super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl == '$')))) break;
      s._4_4_ = strtoul10((char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                          (char **)&anim);
      piVar14 = std::max<int>((int *)((long)&s + 4),&local_e0);
      local_e0 = *piVar14;
      pfVar13 = (float *)std::min<int>((int *)((long)&s + 4),&local_e0);
      d = *pfVar13;
      for (s._0_4_ = 0; uVar2 = (uint)s,
          paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                              ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last),
          uVar2 < paVar15->mNumChannels; s._0_4_ = (uint)s + 1) {
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
        old = (aiVectorKey *)paVar15->mChannels[(uint)s];
        if (((aiNodeAnim *)old)->mNumPositionKeys == filled) {
          local_188 = ((aiNodeAnim *)old)->mPositionKeys;
          uVar11 = (ulong)(filled * 2);
          ((aiNodeAnim *)old)->mNumPositionKeys = filled * 2;
          paVar12 = (aiVectorKey *)operator_new__(uVar11 * 0x18);
          if (uVar11 != 0) {
            local_3d0 = paVar12;
            do {
              aiVectorKey::aiVectorKey(local_3d0);
              local_3d0 = local_3d0 + 1;
            } while (local_3d0 != paVar12 + uVar11);
          }
          old[0x2b].mTime = (double)paVar12;
          memcpy((void *)old[0x2b].mTime,local_188,(ulong)filled * 0x18);
          if (local_188 != (aiVectorKey *)0x0) {
            operator_delete__(local_188);
          }
        }
        bVar4 = SkipSpacesAndLineEnd<char>((char **)&anim);
        if (!bVar4) {
          sub._6_1_ = 1;
          pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_1a8,"CSM: Unexpected EOF occurred reading sample x coord",
                     (allocator *)((long)&sub + 7));
          DeadlyImportError::DeadlyImportError(pDVar6,&local_1a8);
          sub._6_1_ = 0;
          __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
        }
        bVar4 = TokenMatchI((char **)&anim,"DROPOUT",7);
        if (bVar4) {
          this_01 = DefaultLogger::get();
          Logger::warn(this_01,"CSM: Encountered invalid marker data (DROPOUT)");
        }
        else {
          local_1b8 = (double *)
                      ((long)old[0x2b].mTime + (ulong)*(uint *)&old[0x2a].field_0x14 * 0x18);
          *local_1b8 = (double)(int)s._4_4_;
          anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
          super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
               fast_atoreal_move<float>
                         ((char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                          (float *)(local_1b8 + 1),true);
          bVar4 = SkipSpacesAndLineEnd<char>((char **)&anim);
          if (!bVar4) {
            local_1da = 1;
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_1d8,"CSM: Unexpected EOF occurred reading sample y coord",
                       &local_1d9);
            DeadlyImportError::DeadlyImportError(pDVar6,&local_1d8);
            local_1da = 0;
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
          super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
               fast_atoreal_move<float>
                         ((char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                          (float *)((long)local_1b8 + 0xc),true);
          bVar4 = SkipSpacesAndLineEnd<char>((char **)&anim);
          if (!bVar4) {
            local_202 = 1;
            pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&i_2,"CSM: Unexpected EOF occurred reading sample z coord",
                       &local_201);
            DeadlyImportError::DeadlyImportError(pDVar6,(string *)&i_2);
            local_202 = 0;
            __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
          }
          anim._M_t.super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>._M_t.
          super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>.
          super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl =
               (__uniq_ptr_data<aiAnimation,_std::default_delete<aiAnimation>,_true,_true>)
               fast_atoreal_move<float>
                         ((char *)anim._M_t.
                                  super___uniq_ptr_impl<aiAnimation,_std::default_delete<aiAnimation>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_aiAnimation_*,_std::default_delete<aiAnimation>_>
                                  .super__Head_base<0UL,_aiAnimation_*,_false>._M_head_impl,
                          (float *)(local_1b8 + 2),true);
          *(int *)&old[0x2a].field_0x14 = *(int *)&old[0x2a].field_0x14 + 1;
        }
      }
      if (i_1 == filled) {
        filled = filled << 1;
      }
      i_1 = i_1 + 1;
    }
    for (local_208 = 0; uVar2 = local_208,
        paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                            ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last),
        uVar2 < paVar15->mNumChannels; local_208 = local_208 + 1) {
      paVar15 = std::unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_>::operator->
                          ((unique_ptr<aiAnimation,_std::default_delete<aiAnimation>_> *)&last);
      if (paVar15->mChannels[local_208]->mNumPositionKeys == 0) {
        i_3._2_1_ = 1;
        pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_228,"CSM: Invalid marker track",(allocator *)((long)&i_3 + 3));
        DeadlyImportError::DeadlyImportError(pDVar6,&local_228);
        i_3._2_1_ = 0;
        __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
    }
  } while( true );
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}